

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

long perfect_match(char *source,char *target,long sequence_length)

{
  char cVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  if (sequence_length < 1) {
    sequence_length = lVar4;
  }
  lVar3 = 0;
  while( true ) {
    if (sequence_length == lVar4) {
      return lVar3;
    }
    cVar1 = source[lVar4];
    cVar2 = target[lVar4];
    if ((cVar2 != '\x11' && cVar1 != '\x11') && cVar1 != cVar2) break;
    lVar3 = lVar3 + (ulong)((cVar2 != '\x11' && cVar1 != '\x11') && cVar1 == cVar2);
    lVar4 = lVar4 + 1;
  }
  return -1;
}

Assistant:

long perfect_match (const char* source, char* target, const long sequence_length) {
  long matched_bases = 0;
  for (long c = 0; c < sequence_length; c++) {
    char c1 = source[c],
    c2 = target[c];
    
    if (c1 == GAP || c2 == GAP) continue;
    
    if (c1 != c2) {
      return -1;
    }
    
    matched_bases ++;
  }
  return matched_bases;
}